

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cc
# Opt level: O1

void xemmai::anon_unknown_18::f_method_bind(t_pvalue *a_stack)

{
  t_object *ptVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  wstring_view a_message;
  
  uVar2 = *(undefined4 *)((long)&a_stack[1].super_t_pointer.v_p + 4);
  uVar3 = *(undefined4 *)&a_stack[1].field_0;
  uVar4 = *(undefined4 *)((long)&a_stack[1].field_0 + 4);
  *(undefined4 *)&a_stack[2].super_t_pointer.v_p = *(undefined4 *)&a_stack[1].super_t_pointer.v_p;
  *(undefined4 *)((long)&a_stack[2].super_t_pointer.v_p + 4) = uVar2;
  *(undefined4 *)&a_stack[2].field_0 = uVar3;
  *(undefined4 *)((long)&a_stack[2].field_0 + 4) = uVar4;
  ptVar1 = (a_stack->super_t_pointer).v_p;
  auVar5 = (undefined1  [16])(*ptVar1->v_type->f_get_at)(ptVar1,a_stack);
  while( true ) {
    a_message._M_str = auVar5._8_8_;
    if (auVar5._0_8_ == 0xffffffffffffffff) {
      a_stack[1].super_t_pointer.v_p = (t_object *)0x0;
      return;
    }
    ptVar1 = (a_stack->super_t_pointer).v_p;
    if (ptVar1 < (t_object *)0x5) break;
    auVar5 = (undefined1  [16])(*ptVar1->v_type->f_call)(ptVar1,a_stack,auVar5._0_8_);
  }
  a_message._M_len = (size_t)L"not supported.";
  f_throw((xemmai *)0xe,a_message);
}

Assistant:

void f_method_bind(t_pvalue* a_stack)
{
	a_stack[2] = a_stack[1];
	auto p = static_cast<t_object*>(a_stack[0]);
	size_t n = p->f_type()->f_get_at(p, a_stack);
	if (n != size_t(-1)) f_loop(a_stack, n);
	a_stack[1] = nullptr;
}